

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomNormalStaticLayerParams::MergeFrom
          (RandomNormalStaticLayerParams *this,RandomNormalStaticLayerParams *from)

{
  LogMessage *other;
  int64_t iVar1;
  float fVar2;
  uint32_t raw_stddev;
  float tmp_stddev;
  uint32_t raw_mean;
  float tmp_mean;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  RandomNormalStaticLayerParams *local_18;
  RandomNormalStaticLayerParams *from_local;
  RandomNormalStaticLayerParams *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xb673);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)((long)&tmp_mean + 3),other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom
            (&this->outputshape_,&local_18->outputshape_);
  iVar1 = _internal_seed(local_18);
  if (iVar1 != 0) {
    iVar1 = _internal_seed(local_18);
    _internal_set_seed(this,iVar1);
  }
  fVar2 = _internal_mean(local_18);
  if (fVar2 != 0.0) {
    fVar2 = _internal_mean(local_18);
    _internal_set_mean(this,fVar2);
  }
  fVar2 = _internal_stddev(local_18);
  if (fVar2 != 0.0) {
    fVar2 = _internal_stddev(local_18);
    _internal_set_stddev(this,fVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void RandomNormalStaticLayerParams::MergeFrom(const RandomNormalStaticLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.RandomNormalStaticLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  outputshape_.MergeFrom(from.outputshape_);
  if (from._internal_seed() != 0) {
    _internal_set_seed(from._internal_seed());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_mean = from._internal_mean();
  uint32_t raw_mean;
  memcpy(&raw_mean, &tmp_mean, sizeof(tmp_mean));
  if (raw_mean != 0) {
    _internal_set_mean(from._internal_mean());
  }
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_stddev = from._internal_stddev();
  uint32_t raw_stddev;
  memcpy(&raw_stddev, &tmp_stddev, sizeof(tmp_stddev));
  if (raw_stddev != 0) {
    _internal_set_stddev(from._internal_stddev());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}